

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent.capnp.h
# Opt level: O2

Request<capnp::RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::ExportParams,_capnp::Persistent<capnp::AnyPointer,_capnp::AnyPointer>::SaveResults>
* __thiscall
capnp::RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::
Client::exportRequest
          (Request<capnp::RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::ExportParams,_capnp::Persistent<capnp::AnyPointer,_capnp::AnyPointer>::SaveResults>
           *__return_storage_ptr__,Client *this,Maybe<capnp::MessageSize> *sizeHint)

{
  Maybe<capnp::MessageSize> local_20;
  
  local_20.ptr.isSet = (sizeHint->ptr).isSet;
  if (local_20.ptr.isSet == true) {
    local_20.ptr.field_1.value.wordCount = (sizeHint->ptr).field_1.value.wordCount;
    local_20.ptr.field_1._8_8_ = *(undefined8 *)((long)&(sizeHint->ptr).field_1 + 8);
  }
  Capability::Client::
  newCall<capnp::RealmGateway<capnp::AnyPointer,capnp::AnyPointer,capnp::AnyPointer,capnp::AnyPointer>::ExportParams,capnp::Persistent<capnp::AnyPointer,capnp::AnyPointer>::SaveResults>
            (__return_storage_ptr__,
             (Client *)((long)&this->_vptr_Client + (long)this->_vptr_Client[-3]),0x84ff286cd00a3ed4
             ,1,&local_20);
  return __return_storage_ptr__;
}

Assistant:

RealmGateway<InternalRef, ExternalRef, InternalOwner, ExternalOwner>::Client::exportRequest(::kj::Maybe< ::capnp::MessageSize> sizeHint) {
  return newCall<typename  ::capnp::RealmGateway<InternalRef, ExternalRef, InternalOwner, ExternalOwner>::ExportParams, typename  ::capnp::Persistent<ExternalRef, ExternalOwner>::SaveResults>(
      0x84ff286cd00a3ed4ull, 1, sizeHint);
}